

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O1

unique_ptr<grpc_generator::Printer,_std::default_delete<grpc_generator::Printer>_> __thiscall
flatbuffers::FlatBufFile::CreatePrinter(FlatBufFile *this,string *str,char indentation_type)

{
  _func_int **pp_Var1;
  undefined1 in_CL;
  undefined7 in_register_00000011;
  
  pp_Var1 = (_func_int **)operator_new(0x30);
  *pp_Var1 = (_func_int *)&PTR__Printer_003f4360;
  pp_Var1[1] = (_func_int *)CONCAT71(in_register_00000011,indentation_type);
  *(undefined1 *)(pp_Var1 + 2) = 0x24;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x2;
  *(undefined1 *)(pp_Var1 + 5) = in_CL;
  (this->super_File).super_CommentHolder._vptr_CommentHolder = pp_Var1;
  return (__uniq_ptr_data<grpc_generator::Printer,_std::default_delete<grpc_generator::Printer>,_true,_true>
          )(__uniq_ptr_data<grpc_generator::Printer,_std::default_delete<grpc_generator::Printer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<grpc_generator::Printer> CreatePrinter(
      std::string *str, const char indentation_type = ' ') const {
    return std::unique_ptr<grpc_generator::Printer>(
        new FlatBufPrinter(str, indentation_type));
  }